

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O2

vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_> *
__thiscall
wavingz::encoder<signed_char>::operator()
          (vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
           *__return_storage_ptr__,encoder<signed_char> *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          payload_begin,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          payload_end,double silence)

{
  ulong uVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> ch
  ;
  long lVar2;
  size_t ii;
  ulong uVar3;
  bool bVar4;
  double dVar5;
  pair<signed_char,_signed_char> local_6c;
  pair<signed_char,_signed_char> local_6a;
  double local_68;
  complex8_convert<signed_char> *local_60;
  iir_filter<6> *local_58;
  iir_filter<6> *local_50;
  size_t sample;
  double local_40;
  uchar *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60 = &this->convert_iq;
  local_50 = &this->lp1;
  local_58 = &this->lp2;
  local_40 = silence;
  local_38 = payload_end._M_current;
  for (uVar3 = 0; uVar3 != this->sample_rate / 1000; uVar3 = uVar3 + 1) {
    local_68 = iir_filter<6>::operator()(local_50,0.0);
    dVar5 = iir_filter<6>::operator()(local_58,0.0);
    local_6a = complex8_convert<signed_char>::operator()(local_60,local_68,dVar5);
    std::
    vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>::
    emplace_back<std::pair<signed_char,signed_char>>
              ((vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>
                *)__return_storage_ptr__,&local_6a);
  }
  sample = 0;
  lVar2 = 0x14;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    emplace_byte(this,'U',&sample,__return_storage_ptr__);
  }
  emplace_byte(this,-0x10,&sample,__return_storage_ptr__);
  for (; payload_begin._M_current != local_38;
      payload_begin._M_current = payload_begin._M_current + 1) {
    emplace_byte(this,*payload_begin._M_current,&sample,__return_storage_ptr__);
  }
  for (uVar3 = 0;
      dVar5 = (((double)CONCAT44(0x45300000,(int)(this->sample_rate >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)this->sample_rate) - 4503599627370496.0)) * local_40
      , uVar1 = (ulong)dVar5,
      uVar3 != ((long)(dVar5 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1);
      uVar3 = uVar3 + 1) {
    local_68 = iir_filter<6>::operator()(local_50,0.0);
    dVar5 = iir_filter<6>::operator()(local_58,0.0);
    local_6c = complex8_convert<signed_char>::operator()(local_60,local_68,dVar5);
    std::
    vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>::
    emplace_back<std::pair<signed_char,signed_char>>
              ((vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>
                *)__return_storage_ptr__,&local_6c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Byte, Byte>>
    operator()(It payload_begin, It payload_end, double silence = 1.0)
    {
        constexpr uint8_t PREAMBLE = 0x55; // 10101010...10101010 frame preamble
        constexpr uint8_t SOF = 0xF0;      // Start of frame mark

        std::vector<std::pair<Byte, Byte>> iq;

        // .001" silence
        for (size_t ii(0); ii != sample_rate / 1000; ++ii) {
            iq.emplace_back(convert_iq(lp1(0.0), lp2(0.0)));
        }

        size_t sample = 0;

        // preamble
        for (size_t ii(0); ii != 20; ++ii) {
            emplace_byte(PREAMBLE, sample, iq);
        }

        // SOF
        emplace_byte(SOF, sample, iq);

        // payload
        for (It ch = payload_begin; ch != payload_end; ++ch) {
            emplace_byte(*ch, sample, iq);
        }

        // silence at the end (it seems that more or less 1" is needed by the HackRF
        // One to complete transmission?)
        for (size_t ii(0); ii != size_t(silence*sample_rate); ++ii) {
            iq.emplace_back(convert_iq(lp1(0.0), lp2(0.0)));
        }
        return iq;
    }